

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void exchange_fields(int nm1,int nm2)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    if (mpi_rank % 2 == iVar2) {
      if (0 < mpi_rank) {
        send_field_slice(nm1,nm2,mpi_rank + -1);
      }
      if (mpi_rank < n_sr + -1) {
        send_field_slice(*(int *)psr._M_t.
                                 super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                 .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl -
                         (nm2 + nm1),nm1,mpi_rank + 1);
      }
    }
    else {
      if (mpi_rank < n_sr + -1) {
        receive_field_slice(*(int *)psr._M_t.
                                    super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                    .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl -
                            nm2,nm2,mpi_rank + 1);
      }
      if (0 < mpi_rank) {
        receive_field_slice(0,nm1,mpi_rank + -1);
      }
    }
    iVar2 = 1;
    bVar1 = false;
  } while (bVar3);
  return;
}

Assistant:

void exchange_fields(int nm1, int nm2) {
    for (int mod=0; mod<2; mod++) {

        // first even processes send, while odd receive, then vice versa
        if (mpi_rank % 2 == mod) {
            if (mpi_rank > 0) {
                send_field_slice(nm1, nm2, mpi_rank-1);
            }

            if (mpi_rank < n_sr-1) {
                send_field_slice(psr->get_nx() - nm2 - nm1, nm1, mpi_rank+1);
            }
        } else {
            if (mpi_rank < n_sr-1) {
                receive_field_slice(psr->get_nx() - nm2, nm2, mpi_rank+1);
            }

            if (mpi_rank > 0) {
                receive_field_slice(0, nm1, mpi_rank-1);
            }
        }
    }
}